

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash_test_target.cc
# Opt level: O2

uint64_t highwayhash::(anonymous_namespace)::RunHighway<1u>(void *param_1,size_t size)

{
  HHResult64 result;
  HHStateT<1U> state;
  char in [1024];
  uint64_t local_4b0;
  HHStatePortable local_4a8;
  char local_428 [1032];
  
  local_428[0] = (char)size;
  Portable::HHStatePortable::Reset(&local_4a8,anon_unknown_5::RunHighway<1U>::key);
  HighwayHashT<highwayhash::Portable::HHStatePortable,unsigned_long>
            (&local_4a8,local_428,size,&local_4b0);
  return local_4b0;
}

Assistant:

uint64_t RunHighway(const void*, const size_t size) {
  HH_ALIGNAS(32) static const HHKey key = {0, 1, 2, 3};
  char in[kMaxBenchmarkInputSize];
  in[0] = static_cast<char>(size & 0xFF);
  HHResult64 result;
  HHStateT<Target> state(key);
  HighwayHashT(&state, in, size, &result);
  return result;
}